

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompileType<int>(void)

{
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  int result;
  int x;
  bool b2;
  int *p4;
  int *p3;
  int *r;
  int *p2;
  int *p1;
  longdouble ld;
  double d;
  float f;
  size_t size;
  wchar_t w;
  bool b;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> sb;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> st;
  int t;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> i;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> s;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_stack_ffffffffffffff68;
  SafeInt *this;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_18;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_14;
  int local_10 [3];
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_4;
  
  this = (SafeInt *)&local_4;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)this);
  local_10[1] = 0;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<Foo>
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)this,
             (Foo *)in_stack_ffffffffffffff68);
  local_10[0] = 0;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_14,local_10);
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_18,false);
  CompiledMixedType<int,char>();
  CompiledMixedType<int,signed_char>();
  CompiledMixedType<int,unsigned_char>();
  CompiledMixedType<int,short>();
  CompiledMixedType<int,unsigned_short>();
  CompiledMixedType<int,int>();
  CompiledMixedType<int,unsigned_int>();
  CompiledMixedType<int,long>();
  CompiledMixedType<int,unsigned_long>();
  CompiledMixedType<int,long_long>();
  CompiledMixedType<int,unsigned_long_long>();
  ModulusFriendTest<int,char>();
  ModulusFriendTest<int,signed_char>();
  ModulusFriendTest<int,unsigned_char>();
  ModulusFriendTest<int,short>();
  ModulusFriendTest<int,unsigned_short>();
  ModulusFriendTest<int,int>();
  ModulusFriendTest<int,unsigned_int>();
  ModulusFriendTest<int,long>();
  ModulusFriendTest<int,unsigned_long>();
  ModulusFriendTest<int,long_long>();
  ModulusFriendTest<int,unsigned_long_long>();
  SafeInt::operator_cast_to_bool(this);
  SafeInt::operator_cast_to_wchar_t
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)this);
  SafeInt::operator_cast_to_unsigned_long
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)this);
  SafeInt::operator_cast_to_float
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)this);
  SafeInt::operator_cast_to_double
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)this);
  SafeInt::operator_cast_to_long_double
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)this);
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::Ptr(&local_4);
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::Ptr(&local_4);
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::Ref(&local_4);
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&(&local_4);
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&(&local_4);
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator!(&local_14);
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+(&local_14);
  local_10[0] = SafeInt::operator_cast_to_int
                          ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                           this);
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator++
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             (int)((ulong)this >> 0x20));
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator++
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  SVar1 = SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator--
                    ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     (int)((ulong)this >> 0x20));
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator--
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(SVar1.m_int,in_stack_ffffffffffffff80));
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator~
            (in_stack_ffffffffffffff68);
  local_10[0] = SafeInt::operator_cast_to_int
                          ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                           this);
  SafeNegation<int>((int)((ulong)this >> 0x20),&in_stack_ffffffffffffff68->m_int);
  return;
}

Assistant:

void CompileType()
{
	// Test constructors
	SafeInt<T> s;
	SafeInt<T> i(Foo::Foo1);
	T t = 0;
	SafeInt<T> st(t);
	SafeInt<T> sb(false);

	// Mixed operations
	CompiledMixedType<T, char>();
	CompiledMixedType<T, signed char>();
	CompiledMixedType<T, unsigned char>();
	CompiledMixedType<T, short>();
	CompiledMixedType<T, unsigned short>();
	CompiledMixedType<T, int>();
	CompiledMixedType<T, unsigned int>();
	CompiledMixedType<T, long>();
	CompiledMixedType<T, unsigned long>();
	CompiledMixedType<T, long long>();
	CompiledMixedType<T, unsigned long long>();

	// This is making trouble for the compiler
	ModulusFriendTest<T, char>();
	ModulusFriendTest<T, signed char>();
	ModulusFriendTest<T, unsigned char>();
	ModulusFriendTest<T, short>();
	ModulusFriendTest<T, unsigned short>();
	ModulusFriendTest<T, int>();
	ModulusFriendTest<T, unsigned int>();
	ModulusFriendTest<T, long>();
	ModulusFriendTest<T, unsigned long>();
	ModulusFriendTest<T, long long>();
	ModulusFriendTest<T, unsigned long long>();
	
	// Special case casts
	bool b = (bool)s;
	wchar_t w = (wchar_t)s;
	size_t size = (size_t)s;
	float f = (float)s;
	double d = (double)s;
	long double ld = (long double)s;

	// Pointer operations
	T* p1 = s.Ptr();
	const T* p2 = s.Ptr();
	const T& r = s.Ref();
	T* p3 = &s;
	const T* p4 = &s;

	// Unary operators
	bool b2 = !st;
	t = +st;

	st++;
	++st;
	st--;
	--st;
	t = ~st;

	// Get compile time coverage of negation
	T x = 1;
	T result;

	(void)SafeNegation(x, result);

}